

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O3

bool benchmarkMany(string *fn_name,uint32_t n,uint32_t m,uint32_t iterations,
                  pospopcnt_u16_method_type fn,bool verbose,bool test,bool tabular)

{
  undefined1 auVar1 [16];
  uint uVar2;
  pointer puVar3;
  uint16_t *puVar4;
  undefined1 (*pauVar5) [32];
  pointer puVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  byte bVar13;
  byte bVar14;
  uint32_t uVar15;
  string *psVar16;
  uint uVar17;
  result_type rVar18;
  int iVar19;
  pointer pvVar20;
  undefined8 uVar21;
  long lVar22;
  pointer pvVar23;
  double dVar24;
  undefined4 in_register_00000034;
  char *__format;
  undefined7 in_register_00000089;
  bool bVar25;
  ulong uVar26;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *x;
  ulong uVar27;
  long lVar28;
  ushort uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  pospopcnt_u16_method_type p_Var38;
  undefined1 auVar39 [64];
  undefined8 in_XMM7_Qa;
  undefined8 in_XMM7_Qb;
  vector<double,_std::allocator<double>_> avg;
  vector<unsigned_int,_std::allocator<unsigned_int>_> times;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  vdata;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  uniform_int_distribution<int> dis;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  LinuxEvents<0> unified;
  random_device rd;
  mt19937 gen;
  vector<int,_std::allocator<int>_> local_2978;
  double local_2958;
  uint32_t local_2950;
  allocator_type local_2949;
  undefined1 local_2948 [16];
  pointer local_2938;
  pospopcnt_u16_method_type local_2930;
  undefined4 local_2928;
  uint32_t local_2924;
  double local_2920;
  undefined1 local_2918 [16];
  uint *local_2908;
  value_type local_28f8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_28d8;
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  local_28c0;
  undefined1 local_28a8 [16];
  pointer local_2898;
  undefined8 local_2890;
  string *local_2888;
  undefined8 local_2880;
  ulong local_2878;
  param_type local_2870;
  undefined1 local_2868 [16];
  pointer local_2858;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2848;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2830;
  vector<int,_std::allocator<int>_> local_2818;
  LinuxEvents<0> local_2800;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  
  local_2890 = CONCAT44(in_register_00000034,n);
  local_2928 = (undefined4)CONCAT71(in_register_00000089,verbose);
  local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2930 = fn;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_2740.field_0,(ulong)n
             ,(allocator_type *)&local_13b8);
  local_2958 = (double)(ulong)m;
  local_2950 = m;
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::vector(&local_28c0,(size_type)local_2958,(value_type *)&local_2740.field_0,
           (allocator_type *)&local_2800);
  if ((void *)CONCAT44(local_2740._M_mt._M_x[0]._4_4_,local_2740._M_mt._M_x[0]._0_4_) != (void *)0x0
     ) {
    operator_delete((void *)CONCAT44(local_2740._M_mt._M_x[0]._4_4_,local_2740._M_mt._M_x[0]._0_4_))
    ;
  }
  if ((char)local_2928 == '\x01' && !tabular) {
    printf("alignments: ");
    pvVar23 = local_28c0.
              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar20 = local_28c0.
                   super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar20 != pvVar23;
        pvVar20 = pvVar20 + 1) {
      printf("%d ",(ulong)(-*(int *)&(pvVar20->
                                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                     )._M_impl.super__Vector_impl_data._M_start &
                          *(uint *)&(pvVar20->
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    )._M_impl.super__Vector_impl_data._M_start));
    }
    putchar(10);
  }
  local_2740._M_mt._M_x[0]._0_4_ = 0;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 0;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 1;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 5;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 5;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 2;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 3;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 9;
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_2978,
               (iterator)
               local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 9;
    local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_2818,&local_2978);
  LinuxEvents<0>::LinuxEvents(&local_2800,&local_2818);
  if (local_2818.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2818.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2898 = (pointer)0x0;
  local_2908 = (uint *)0x0;
  local_2868 = (undefined1  [16])0x0;
  local_2858 = (pointer)0x0;
  local_28a8 = (undefined1  [16])0x0;
  local_2918 = (undefined1  [16])0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)local_2868,
             (long)local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  std::random_device::random_device((random_device *)&local_2740.field_0);
  uVar17 = std::random_device::_M_getval();
  local_13b8._M_x[0] = (unsigned_long)uVar17;
  local_2920 = (double)CONCAT71(local_2920._1_7_,test);
  lVar22 = 1;
  uVar27 = local_13b8._M_x[0];
  do {
    uVar27 = (ulong)(((uint)(uVar27 >> 0x1e) ^ (uint)uVar27) * 0x6c078965 + (int)lVar22);
    local_13b8._M_x[lVar22] = uVar27;
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x270);
  local_13b8._M_p = 0x270;
  local_2870._M_a = 0;
  local_2870._M_b = 0xffff;
  local_2924 = iterations;
  local_2888 = fn_name;
  if (iterations == 0) {
    bVar25 = true;
  }
  else {
    local_2920 = (double)((ulong)local_2920 ^ 1);
    uVar27 = 0;
    lVar22 = (long)local_2958 * 0x18;
    bVar25 = true;
    do {
      local_2878 = uVar27;
      if (local_28c0.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_28c0.
          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar27 = 0;
        pvVar20 = local_28c0.
                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pvVar23 = local_28c0.
                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          if (pvVar23[uVar27].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_finish !=
              pvVar23[uVar27].super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
              _M_impl.super__Vector_impl_data._M_start) {
            uVar26 = 0;
            do {
              rVar18 = std::uniform_int_distribution<int>::operator()
                                 ((uniform_int_distribution<int> *)&local_2870,&local_13b8,
                                  &local_2870);
              puVar3 = local_28c0.
                       super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar27].
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar3[uVar26] = (unsigned_short)rVar18;
              uVar26 = uVar26 + 1;
              pvVar20 = local_28c0.
                        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              pvVar23 = local_28c0.
                        super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar26 < (ulong)((long)local_28c0.
                                            super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar27].
                                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)puVar3 >> 1));
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 < (ulong)(((long)pvVar20 - (long)pvVar23 >> 3) * -0x5555555555555555));
      }
      local_2938 = (pointer)0x0;
      local_2948 = (undefined1  [16])0x0;
      local_2948._0_8_ = operator_new(0x40);
      local_2938 = (pointer)(local_2948._0_8_ + 0x40);
      auVar33 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])local_2948._0_8_ = auVar33;
      local_2948._8_8_ = local_2938;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector(&local_28d8,(size_type)local_2958,(value_type *)local_2948,
               (allocator_type *)&local_28f8);
      uVar15 = local_2950;
      if ((pointer)local_2948._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_2948._0_8_);
      }
      if (uVar15 != 0) {
        lVar28 = 0;
        do {
          puVar4 = *(uint16_t **)
                    ((long)&((local_28c0.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar28);
          pospopcnt_u16_scalar_naive
                    (puVar4,(uint32_t)
                            ((ulong)(*(long *)((long)&((local_28c0.
                                                                                                                
                                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                              lVar28) - (long)puVar4) >> 1),
                     *(uint32_t **)
                      ((long)&((local_28d8.
                                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar28));
          lVar28 = lVar28 + 0x18;
        } while (lVar22 != lVar28);
      }
      local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)operator_new(0x40);
      local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)local_28f8.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start + 0x40);
      auVar33 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
      *(undefined1 (*) [64])
       local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start = auVar33;
      local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)local_2948,(size_type)local_2958,&local_28f8,&local_2949);
      if (local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      iVar19 = std::chrono::_V2::system_clock::now();
      LinuxEvents<0>::start(&local_2800);
      if (uVar15 != 0) {
        lVar28 = 0;
        do {
          puVar4 = *(uint16_t **)
                    ((long)&((local_28c0.
                              super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                            _M_impl.super__Vector_impl_data._M_start + lVar28);
          (*local_2930)(puVar4,(uint32_t)
                               ((ulong)(*(long *)((long)&((local_28c0.
                                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish +
                                                 lVar28) - (long)puVar4) >> 1),
                        *(uint32_t **)
                         ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  local_2948._0_8_)->_M_impl).super__Vector_impl_data._M_start +
                         lVar28));
          lVar28 = lVar28 + 0x18;
        } while (lVar22 != lVar28);
      }
      LinuxEvents<0>::end(&local_2800,
                          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                          local_2868);
      uVar21 = std::chrono::_V2::system_clock::now();
      if (uVar15 == 0) {
LAB_001193a4:
        bVar7 = false;
      }
      else {
        lVar28 = 0;
        uVar27 = 0;
        do {
          pauVar5 = *(undefined1 (**) [32])
                     ((long)&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                              local_2948._0_8_)->_M_impl).super__Vector_impl_data._M_start + lVar28)
          ;
          lVar28 = lVar28 + 0x18;
          auVar33 = vpmovzxdq_avx512f(*pauVar5);
          auVar34 = vpmovzxdq_avx512f(pauVar5[1]);
          auVar33 = vpaddq_avx512f(ZEXT864(uVar27),auVar33);
          auVar33 = vpaddq_avx512f(auVar33,auVar34);
          auVar32 = vextracti64x4_avx512f(auVar33,1);
          auVar33 = vpaddq_avx512f(auVar33,ZEXT3264(auVar32));
          auVar8 = vpaddq_avx(auVar33._0_16_,auVar33._16_16_);
          auVar30 = vpshufd_avx(auVar8,0xee);
          auVar8 = vpaddq_avx(auVar8,auVar30);
          uVar27 = auVar8._0_8_;
        } while (lVar22 != lVar28);
        if (uVar27 == 0) goto LAB_001193a4;
        local_2880 = uVar21;
        if (uVar15 != 0) {
          dVar24 = 0.0;
          do {
            lVar28 = 0;
            do {
              uVar17 = local_28d8.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar24].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar28];
              uVar2 = (((pointer)(local_2948._0_8_ + dVar24 * 0x18))->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar28];
              if (uVar17 != uVar2 && local_2920._0_1_ == '\0') {
                puts("bug:");
                bVar7 = false;
                printf("expected : ");
                print16(local_28d8.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)dVar24].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
                printf("got      : ");
                print16((((pointer)(local_2948._0_8_ + dVar24 * 0x18))->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_start);
                goto LAB_00119465;
              }
              lVar28 = lVar28 + 1;
              bVar25 = (bool)(bVar25 & uVar17 == uVar2);
            } while (lVar28 != 0x10);
            dVar24 = (double)((long)dVar24 + 1);
          } while (dVar24 != local_2958);
        }
        std::
        vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
        ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                     *)local_28a8,(value_type *)local_2868);
        uVar17 = (int)local_2880 - iVar19;
        local_28f8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = uVar17;
        if ((uint *)local_2918._8_8_ == local_2908) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2918,
                     (iterator)local_2918._8_8_,(uint *)&local_28f8);
        }
        else {
          *(uint *)local_2918._8_8_ = uVar17;
          local_2918._8_8_ = (uint *)(local_2918._8_8_ + 4);
        }
        bVar7 = true;
      }
LAB_00119465:
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 *)local_2948);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&local_28d8);
      if (!bVar7) {
        bVar25 = false;
        goto LAB_00119841;
      }
      uVar17 = (int)local_2878 + 1;
      uVar27 = (ulong)uVar17;
    } while (uVar17 != local_2924);
  }
  uVar15 = local_2950;
  if (local_2918._0_8_ == local_2918._8_8_) {
    uVar27 = 0;
  }
  else {
    auVar33 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar34 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar39 = ZEXT1664((undefined1  [16])0x0);
    uVar26 = 0;
    auVar35 = vpbroadcastq_avx512f();
    auVar35 = vpsrlq_avx512f(auVar35,2);
    uVar27 = ((ulong)(local_2918._8_8_ + (-4 - local_2918._0_8_)) >> 2) + 0x10 & 0xfffffffffffffff0;
    do {
      auVar36 = vpbroadcastq_avx512f();
      auVar37 = vmovdqa64_avx512f(auVar39);
      auVar39 = vporq_avx512f(auVar36,auVar33);
      auVar36 = vporq_avx512f(auVar36,auVar34);
      uVar21 = vpcmpuq_avx512f(auVar36,auVar35,2);
      bVar13 = (byte)uVar21;
      uVar21 = vpcmpuq_avx512f(auVar39,auVar35,2);
      bVar14 = (byte)uVar21;
      uVar29 = CONCAT11(bVar14,bVar13);
      auVar39 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_2918._0_8_ + uVar26 * 4));
      auVar36._4_4_ = (uint)((byte)(uVar29 >> 1) & 1) * auVar39._4_4_;
      auVar36._0_4_ = (uint)(bVar13 & 1) * auVar39._0_4_;
      auVar36._8_4_ = (uint)((byte)(uVar29 >> 2) & 1) * auVar39._8_4_;
      auVar36._12_4_ = (uint)((byte)(uVar29 >> 3) & 1) * auVar39._12_4_;
      auVar36._16_4_ = (uint)((byte)(uVar29 >> 4) & 1) * auVar39._16_4_;
      auVar36._20_4_ = (uint)((byte)(uVar29 >> 5) & 1) * auVar39._20_4_;
      auVar36._24_4_ = (uint)((byte)(uVar29 >> 6) & 1) * auVar39._24_4_;
      auVar36._28_4_ = (uint)((byte)(uVar29 >> 7) & 1) * auVar39._28_4_;
      auVar36._32_4_ = (uint)(bVar14 & 1) * auVar39._32_4_;
      auVar36._36_4_ = (uint)(bVar14 >> 1 & 1) * auVar39._36_4_;
      auVar36._40_4_ = (uint)(bVar14 >> 2 & 1) * auVar39._40_4_;
      auVar36._44_4_ = (uint)(bVar14 >> 3 & 1) * auVar39._44_4_;
      auVar36._48_4_ = (uint)(bVar14 >> 4 & 1) * auVar39._48_4_;
      auVar36._52_4_ = (uint)(bVar14 >> 5 & 1) * auVar39._52_4_;
      auVar36._56_4_ = (uint)(bVar14 >> 6 & 1) * auVar39._56_4_;
      auVar36._60_4_ = (uint)(bVar14 >> 7) * auVar39._60_4_;
      uVar26 = uVar26 + 0x10;
      auVar39 = vpaddd_avx512f(auVar36,auVar37);
    } while (uVar27 != uVar26);
    auVar33 = vmovdqa32_avx512f(auVar39);
    auVar34._0_4_ = (uint)(bVar13 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar13 & 1) * auVar37._0_4_;
    bVar7 = (bool)((byte)(uVar29 >> 1) & 1);
    auVar34._4_4_ = (uint)bVar7 * auVar33._4_4_ | (uint)!bVar7 * auVar37._4_4_;
    bVar7 = (bool)((byte)(uVar29 >> 2) & 1);
    auVar34._8_4_ = (uint)bVar7 * auVar33._8_4_ | (uint)!bVar7 * auVar37._8_4_;
    bVar7 = (bool)((byte)(uVar29 >> 3) & 1);
    auVar34._12_4_ = (uint)bVar7 * auVar33._12_4_ | (uint)!bVar7 * auVar37._12_4_;
    bVar7 = (bool)((byte)(uVar29 >> 4) & 1);
    auVar34._16_4_ = (uint)bVar7 * auVar33._16_4_ | (uint)!bVar7 * auVar37._16_4_;
    bVar7 = (bool)((byte)(uVar29 >> 5) & 1);
    auVar34._20_4_ = (uint)bVar7 * auVar33._20_4_ | (uint)!bVar7 * auVar37._20_4_;
    bVar7 = (bool)((byte)(uVar29 >> 6) & 1);
    auVar34._24_4_ = (uint)bVar7 * auVar33._24_4_ | (uint)!bVar7 * auVar37._24_4_;
    bVar7 = (bool)((byte)(uVar29 >> 7) & 1);
    auVar34._28_4_ = (uint)bVar7 * auVar33._28_4_ | (uint)!bVar7 * auVar37._28_4_;
    auVar34._32_4_ =
         (uint)(bVar14 & 1) * auVar33._32_4_ | (uint)!(bool)(bVar14 & 1) * auVar37._32_4_;
    bVar7 = (bool)(bVar14 >> 1 & 1);
    auVar34._36_4_ = (uint)bVar7 * auVar33._36_4_ | (uint)!bVar7 * auVar37._36_4_;
    bVar7 = (bool)(bVar14 >> 2 & 1);
    auVar34._40_4_ = (uint)bVar7 * auVar33._40_4_ | (uint)!bVar7 * auVar37._40_4_;
    bVar7 = (bool)(bVar14 >> 3 & 1);
    auVar34._44_4_ = (uint)bVar7 * auVar33._44_4_ | (uint)!bVar7 * auVar37._44_4_;
    bVar7 = (bool)(bVar14 >> 4 & 1);
    auVar34._48_4_ = (uint)bVar7 * auVar33._48_4_ | (uint)!bVar7 * auVar37._48_4_;
    bVar7 = (bool)(bVar14 >> 5 & 1);
    auVar34._52_4_ = (uint)bVar7 * auVar33._52_4_ | (uint)!bVar7 * auVar37._52_4_;
    bVar7 = (bool)(bVar14 >> 6 & 1);
    auVar34._56_4_ = (uint)bVar7 * auVar33._56_4_ | (uint)!bVar7 * auVar37._56_4_;
    auVar34._60_4_ =
         (uint)(bVar14 >> 7) * auVar33._60_4_ | (uint)!(bool)(bVar14 >> 7) * auVar37._60_4_;
    auVar32 = vextracti64x4_avx512f(auVar34,1);
    auVar33 = vpaddd_avx512f(auVar34,ZEXT3264(auVar32));
    auVar8 = vpaddd_avx(auVar33._0_16_,auVar33._16_16_);
    auVar30 = vpshufd_avx(auVar8,0xee);
    auVar8 = vpaddd_avx(auVar8,auVar30);
    auVar30 = vpshufd_avx(auVar8,0x55);
    auVar8 = vpaddd_avx(auVar8,auVar30);
    uVar27 = CONCAT44((int)(uVar27 >> 0x20),auVar8._0_4_);
  }
  lVar22 = local_2918._8_8_ - local_2918._0_8_;
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector(&local_2830,
           (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)local_28a8);
  compute_mins((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)&local_28d8,
               &local_2830);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&local_2830);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector(&local_2848,
           (vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
            *)local_28a8);
  compute_averages((vector<double,_std::allocator<double>_> *)local_2948,&local_2848);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&local_2848);
  psVar16 = local_2888;
  iVar19 = (int)local_2890;
  auVar8._8_8_ = in_XMM7_Qb;
  auVar8._0_8_ = in_XMM7_Qa;
  auVar8 = vcvtusi2sd_avx512f(auVar8,iVar19 * 2);
  dVar24 = auVar8._0_8_ * 9.5367431640625e-07;
  if (tabular) {
    if (local_2924 != 0) {
      uVar27 = (ulong)local_2924;
      auVar9._8_8_ = in_XMM7_Qb;
      auVar9._0_8_ = in_XMM7_Qa;
      auVar8 = vcvtusi2sd_avx512f(auVar9,uVar15 * iVar19);
      uVar26 = 0;
      local_2958 = auVar8._0_8_;
      local_2920 = dVar24;
      do {
        auVar10._8_8_ = in_XMM7_Qb;
        auVar10._0_8_ = in_XMM7_Qa;
        auVar8 = vcvtusi2sd_avx512f(auVar10,*(pointer)(local_2918._0_8_ + uVar26 * 4));
        local_2930 = (pospopcnt_u16_method_type)(local_2920 / (auVar8._0_8_ / 1000000000.0));
        printf("%s\t%u\t%d\t",(psVar16->_M_dataplus)._M_p,local_2890,uVar26 & 0xffffffff);
        auVar30 = vcvtuqq2pd_avx512vl(*(undefined1 (*) [16])
                                       (((pointer)(local_28a8._0_8_ + uVar26 * 0x18))->
                                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                       )._M_impl.super__Vector_impl_data._M_start);
        auVar8 = vshufpd_avx(auVar30,auVar30,1);
        printf("%4.2f\t%4.3f\t%4.3f\t",auVar8._0_8_ / auVar30._0_8_,auVar30._0_8_ / local_2958,
               auVar8._0_8_ / local_2958);
        puVar6 = (((pointer)(local_28a8._0_8_ + uVar26 * 0x18))->
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        printf("%llu\t%llu\t%llu\t%llu\t%llu\t",*puVar6,puVar6[1],puVar6[2],puVar6[3],puVar6[4]);
        printf("%u\t%4.2f\n",local_2930,(ulong)*(uint *)(local_2918._0_8_ + uVar26 * 4));
        uVar26 = uVar26 + 1;
      } while (uVar26 != uVar27);
    }
  }
  else {
    if ((char)local_2928 == '\0') {
      auVar30._8_8_ = in_XMM7_Qb;
      auVar30._0_8_ = in_XMM7_Qa;
      auVar30 = vcvtusi2sd_avx512f(auVar30,((local_28d8.
                                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           )._M_impl.super__Vector_impl_data._M_start);
      __format = "cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n";
      auVar31._8_8_ = in_XMM7_Qb;
      auVar31._0_8_ = in_XMM7_Qa;
      auVar8 = vcvtusi2sd_avx512f(auVar31,uVar15 * iVar19);
      dVar24 = auVar30._0_8_ / auVar8._0_8_;
      auVar12._8_8_ = in_XMM7_Qb;
      auVar12._0_8_ = in_XMM7_Qa;
      auVar30 = vcvtusi2sd_avx512f(auVar12,local_28d8.
                                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      p_Var38 = (pospopcnt_u16_method_type)(auVar30._0_8_ / auVar8._0_8_);
    }
    else {
      local_2958 = (double)(uVar27 / (ulong)(lVar22 >> 2));
      local_2930 = (pospopcnt_u16_method_type)(dVar24 / (local_2958 / 1000000000.0));
      auVar1._0_8_ = ((local_28d8.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
      auVar1._8_8_ = ((local_28d8.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
      auVar31 = vcvtuqq2pd_avx512vl(auVar1);
      auVar8 = vshufpd_avx(auVar31,auVar31,1);
      auVar11._8_8_ = in_XMM7_Qb;
      auVar11._0_8_ = in_XMM7_Qa;
      auVar30 = vcvtusi2sd_avx512f(auVar11,uVar15 * iVar19);
      printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, instructions per 16-bit word %4.3f \n"
             ,auVar8._0_8_ / auVar31._0_8_,auVar31._0_8_ / auVar30._0_8_,
             auVar8._0_8_ / auVar30._0_8_);
      printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
             ,((local_28d8.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start,
             ((local_28d8.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             ((local_28d8.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             local_28d8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_28d8.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish);
      printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
             ,(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2948._0_8_)->
              _M_impl).super__Vector_impl_data._M_start,
             (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2948._0_8_)->
             _M_impl).super__Vector_impl_data._M_finish,
             (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_2948._0_8_)->
             _M_impl).super__Vector_impl_data._M_end_of_storage,
             (((pointer)(local_2948._0_8_ + 0x18))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (((pointer)(local_2948._0_8_ + 0x18))->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish);
      __format = "avg time: %f ns, %4.2f mb/s\n";
      dVar24 = local_2958;
      p_Var38 = local_2930;
    }
    printf(__format,dVar24,p_Var38);
  }
  if ((pointer)local_2948._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2948._0_8_);
  }
  if (local_28d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28d8.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_00119841:
  std::random_device::_M_fini();
  if ((pointer)local_2918._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2918._0_8_);
  }
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
             *)local_28a8);
  if ((pointer)local_2868._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2868._0_8_);
  }
  LinuxEvents<0>::~LinuxEvents(&local_2800);
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector(&local_28c0);
  if (local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2978.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar25;
}

Assistant:

bool benchmarkMany(const std::string& fn_name, uint32_t n, uint32_t m, uint32_t iterations, pospopcnt_u16_method_type fn, bool verbose, bool test, bool tabular) {
    std::vector<int> evts;
#ifdef ALIGN
    std::vector<std::vector<uint16_t,AlignedSTLAllocator<uint16_t,64>>> vdata(m, std::vector<uint16_t,AlignedSTLAllocator<uint16_t,64>>(n));
#else
    std::vector<std::vector<uint16_t>> vdata(m, std::vector<uint16_t>(n));
#endif
#ifdef ALIGN
    for(auto & x : vdata) {
      assert(get_alignment(x.data()) == 64);
    }
#endif
    if(verbose && !tabular) {
      printf("alignments: ");
      for(auto & x : vdata) {
        printf("%d ", get_alignment(x.data()));
      }
      printf("\n");
    }    
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    std::vector<uint32_t> times;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFFFF);

    bool isok = true;
    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < vdata.size(); k++) {
            for(size_t k2 = 0; k2 < vdata[k].size() ; k2++) { 
               vdata[k][k2] = dis(gen); // random init.
            }
        }
        std::vector<std::vector<uint32_t>> correctflags(m,std::vector<uint32_t>(16));
        for (size_t k = 0; k < m; k++) {
          pospopcnt_u16_scalar_naive(vdata[k].data(), vdata[k].size(), correctflags[k].data()); // this is our gold standard
        }
        std::vector<std::vector<uint32_t>> flags(m,std::vector<uint32_t>(16));
        
        const clockdef t1 = std::chrono::high_resolution_clock::now();
        unified.start();
        for (size_t k = 0; k < m ; k++) {
          fn(vdata[k].data(), vdata[k].size(), flags[k].data());
        }
        unified.end(results);
        const clockdef t2 = std::chrono::high_resolution_clock::now();

        uint64_t tot_obs = 0;
        for (size_t km = 0; km < m; ++km)
          for (size_t k = 0; k < 16; ++k) tot_obs += flags[km][k];
        if (tot_obs == 0) { // when a method is not supported it returns all zero
            return false;
        }
        for (size_t km = 0; km < m; ++km) {
          for (size_t k = 0; k < 16; k++) {
            if (correctflags[km][k] != flags[km][k]) {
                if (test) {
                    printf("bug:\n");
                    printf("expected : ");
                    print16(correctflags[km].data());
                    printf("got      : ");
                    print16(flags[km].data());
                    return false;
                } else {
                    isok = false;
                }
            }
          }
        }
        allresults.push_back(results);

        const auto time_span = std::chrono::duration_cast<std::chrono::nanoseconds>(t2 - t1);
        times.push_back(time_span.count());
    }

    uint32_t tot_time = std::accumulate(times.begin(), times.end(), 0);
    double mean_time = tot_time / times.size();

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);

    double throughput = ((2*n) / (1024*1024.0)) / (mean_time / 1000000000.0);
    
    if (tabular) {
        for (int i = 0; i < iterations; ++i) {
            throughput = ((2*n) / (1024*1024.0)) / (times[i] / 1000000000.0);
            printf("%s\t%u\t%d\t", fn_name.c_str(), n, i);
            printf("%4.2f\t%4.3f\t%4.3f\t",
                    double(allresults[i][1]) / allresults[i][0], double(allresults[i][0]) / (n*m), double(allresults[i][1]) / (n*m));
            printf("%llu\t%llu\t%llu\t%llu\t%llu\t",
                    allresults[i][0], allresults[i][1], allresults[i][2], allresults[i][3], allresults[i][4]);
            printf("%u\t%4.2f\n", times[i], throughput);
        }
    } else if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, "
               "instructions per 16-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / (n*m), double(mins[1]) / (n*m));
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
        printf("avg time: %f ns, %4.2f mb/s\n", mean_time, throughput);
    } else {
        printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n", double(mins[0]) / (n*m), double(mins[5]) / (n*m));
    }

    return isok;
}